

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_posix::basic_numpunct::basic_numpunct(basic_numpunct *this,locale_t lc)

{
  char *pcVar1;
  __locale_t in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40);
  pcVar1 = nl_langinfo_l(0x10001,in_RSI);
  std::__cxx11::string::operator=(in_RDI + 0x20,pcVar1);
  pcVar1 = nl_langinfo_l(0x10000,in_RSI);
  std::__cxx11::string::operator=(in_RDI + 0x40,pcVar1);
  pcVar1 = nl_langinfo_l(0x10002,in_RSI);
  std::__cxx11::string::operator=(in_RDI,pcVar1);
  return;
}

Assistant:

basic_numpunct(locale_t lc) 
    {
    #if defined(__APPLE__) || defined(__FreeBSD__)
        lconv *cv = localeconv_l(lc);
        grouping = cv->grouping;
        thousands_sep = cv->thousands_sep;
        decimal_point = cv->decimal_point;
    #else
        thousands_sep = nl_langinfo_l(THOUSEP,lc);
        decimal_point = nl_langinfo_l(RADIXCHAR,lc);
        #ifdef GROUPING
        grouping = nl_langinfo_l(GROUPING,lc);
        #endif
    #endif
    }